

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Importer::Importer
          (Importer *this,SourceTree *source_tree,MultiFileErrorCollector *error_collector)

{
  SourceTreeDescriptorDatabase::SourceTreeDescriptorDatabase(&this->database_,source_tree);
  (this->database_).using_validation_error_collector_ = true;
  DescriptorPool::DescriptorPool
            (&this->pool_,(DescriptorDatabase *)this,
             &(this->database_).validation_error_collector_.super_ErrorCollector);
  (this->pool_).enforce_weak_ = true;
  (this->database_).error_collector_ = error_collector;
  return;
}

Assistant:

Importer::Importer(SourceTree* source_tree,
                   MultiFileErrorCollector* error_collector)
    : database_(source_tree),
      pool_(&database_, database_.GetValidationErrorCollector()) {
  pool_.EnforceWeakDependencies(true);
  database_.RecordErrorsTo(error_collector);
}